

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
                   static_string_view *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_38;
  size_t local_20;
  char *pcStack_18;
  undefined8 local_10;
  
  local_38.first._M_str = (a->_M_dataplus)._M_p;
  local_38.first._M_len = a->_M_string_length;
  local_38.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20 = (b->super_string_view)._M_len;
  pcStack_18 = (b->super_string_view)._M_str;
  local_10 = 0;
  views._M_len = 2;
  views._M_array = &local_38;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}